

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testReplaceExisting.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  lh_table *plVar4;
  char *pcVar5;
  void *pvVar6;
  char *pcVar7;
  lh_entry *entry_nextkey2;
  lh_entry *entrykey2;
  json_object *val2;
  char *key2;
  int retval;
  int new_count;
  lh_entry *entry_nextkey;
  lh_entry *entrykey;
  json_object *val;
  char *key;
  char *original_key;
  lh_entry *entry_nextkey0;
  lh_entry *entrykey0;
  json_object *val0;
  char *key0;
  int orig_count;
  json_object *my_object;
  char **argv_local;
  int argc_local;
  
  uVar2 = json_object_new_object();
  uVar3 = json_object_new_string("bar1");
  json_object_object_add(uVar2,"foo1",uVar3);
  uVar3 = json_object_new_string("bar2");
  json_object_object_add(uVar2,"foo2",uVar3);
  uVar3 = json_object_new_string("bar2");
  json_object_object_add(uVar2,"deleteme",uVar3);
  uVar3 = json_object_new_string("bar3");
  json_object_object_add(uVar2,"foo3",uVar3);
  printf("==== delete-in-loop test starting ====\n");
  key0._4_4_ = 0;
  plVar4 = (lh_table *)json_object_get_object(uVar2);
  entry_nextkey0 = lh_table_head(plVar4);
  while (entry_nextkey0 != (lh_entry *)0x0) {
    pcVar5 = (char *)lh_entry_k(entry_nextkey0);
    pvVar6 = lh_entry_v(entry_nextkey0);
    entry_nextkey0 = lh_entry_next(entry_nextkey0);
    printf("Key at index %d is [%s] %d",(ulong)key0._4_4_,pcVar5,(ulong)(pvVar6 == (void *)0x0));
    iVar1 = strcmp(pcVar5,"deleteme");
    if (iVar1 == 0) {
      json_object_object_del(uVar2,pcVar5);
      printf(" (deleted)\n");
    }
    else {
      printf(" (kept)\n");
    }
    key0._4_4_ = key0._4_4_ + 1;
  }
  printf("==== replace-value first loop starting ====\n");
  key = (char *)0x0;
  key0._4_4_ = 0;
  plVar4 = (lh_table *)json_object_get_object(uVar2);
  entry_nextkey = lh_table_head(plVar4);
  while (entry_nextkey != (lh_entry *)0x0) {
    pcVar5 = (char *)lh_entry_k(entry_nextkey);
    pvVar6 = lh_entry_v(entry_nextkey);
    entry_nextkey = lh_entry_next(entry_nextkey);
    printf("Key at index %d is [%s] %d\n",(ulong)key0._4_4_,pcVar5,(ulong)(pvVar6 == (void *)0x0));
    key0._4_4_ = key0._4_4_ + 1;
    iVar1 = strcmp(pcVar5,"foo2");
    if (iVar1 == 0) {
      printf("replacing value for key [%s]\n",pcVar5);
      uVar3 = json_object_new_string("zzz");
      json_object_object_add(uVar2,pcVar5,uVar3);
      key = pcVar5;
    }
  }
  printf("==== second loop starting ====\n");
  key2._4_4_ = 0;
  key2._0_4_ = 0;
  plVar4 = (lh_table *)json_object_get_object(uVar2);
  entry_nextkey2 = lh_table_head(plVar4);
  while (entry_nextkey2 != (lh_entry *)0x0) {
    pcVar5 = (char *)lh_entry_k(entry_nextkey2);
    pvVar6 = lh_entry_v(entry_nextkey2);
    entry_nextkey2 = lh_entry_next(entry_nextkey2);
    printf("Key at index %d is [%s] %d\n",(ulong)key2._4_4_,pcVar5,(ulong)(pvVar6 == (void *)0x0));
    key2._4_4_ = key2._4_4_ + 1;
    iVar1 = strcmp(pcVar5,"foo2");
    if (iVar1 == 0) {
      pcVar7 = "NOT ";
      if (pcVar5 == key) {
        pcVar7 = "";
      }
      printf("pointer for key [%s] does %smatch\n",pcVar5,pcVar7);
      if (pcVar5 != key) {
        key2._0_4_ = 1;
      }
    }
  }
  if (key2._4_4_ != key0._4_4_) {
    printf("mismatch between original count (%d) and new count (%d)\n",(ulong)key0._4_4_,
           (ulong)key2._4_4_);
    key2._0_4_ = 1;
  }
  json_object_put(uVar2);
  return (int)key2;
}

Assistant:

int main(int argc, char **argv)
{
	MC_SET_DEBUG(1);

	/*
	 * Check that replacing an existing object keeps the key valid,
	 * and that it keeps the order the same.
	 */
	json_object *my_object = json_object_new_object();
	json_object_object_add(my_object, "foo1", json_object_new_string("bar1"));
	json_object_object_add(my_object, "foo2", json_object_new_string("bar2"));
	json_object_object_add(my_object, "deleteme", json_object_new_string("bar2"));
	json_object_object_add(my_object, "foo3", json_object_new_string("bar3"));

	printf("==== delete-in-loop test starting ====\n");

	int orig_count = 0;
	json_object_object_foreach(my_object, key0, val0)
	{
		printf("Key at index %d is [%s] %d", orig_count, key0, (val0 == NULL));
		if (strcmp(key0, "deleteme") == 0)
		{
			json_object_object_del(my_object, key0);
			printf(" (deleted)\n");
		}
		else
			printf(" (kept)\n");
		orig_count++;
	}

	printf("==== replace-value first loop starting ====\n");

	const char *original_key = NULL;
	orig_count = 0;
	json_object_object_foreach(my_object, key, val)
	{
		printf("Key at index %d is [%s] %d\n", orig_count, key, (val == NULL));
		orig_count++;
		if (strcmp(key, "foo2") != 0)
			continue;
		printf("replacing value for key [%s]\n", key);
		original_key = key;
		json_object_object_add(my_object, key, json_object_new_string("zzz"));
	}

	printf("==== second loop starting ====\n");

	int new_count = 0;
	int retval = 0;
	json_object_object_foreach(my_object, key2, val2)
	{
		printf("Key at index %d is [%s] %d\n", new_count, key2, (val2 == NULL));
		new_count++;
		if (strcmp(key2, "foo2") != 0)
			continue;
		printf("pointer for key [%s] does %smatch\n", key2,
		       (key2 == original_key) ? "" : "NOT ");
		if (key2 != original_key)
			retval = 1;
	}
	if (new_count != orig_count)
	{
		printf("mismatch between original count (%d) and new count (%d)\n", orig_count,
		       new_count);
		retval = 1;
	}

	json_object_put(my_object);

	return retval;
}